

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

bool __thiscall jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,Object *object)

{
  Kind KVar1;
  pointer pFVar2;
  uint uVar3;
  ObjectField *field;
  pointer pOVar4;
  ostream *poVar5;
  FodderElement *elem_1;
  pointer pFVar6;
  Fodder *pFVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  pOVar4 = (object->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    bVar10 = pOVar4 == (object->fields).
                       super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar10) {
LAB_001b1c01:
      pFVar6 = (object->closeFodder).
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar2 = (object->closeFodder).
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar3 = 0;
      if (pFVar6 != pFVar2) {
        do {
          KVar1 = pFVar6->kind;
          if (KVar1 == PARAGRAPH) {
            iVar8 = (int)((ulong)((long)(pFVar6->comment).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pFVar6->comment).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                    pFVar6->blanks;
          }
          else {
            iVar8 = 0;
            if (KVar1 != INTERSTITIAL) {
              if (KVar1 != LINE_END) {
LAB_001b1c50:
                poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown FodderElement kind");
                std::endl<char,std::char_traits<char>>(poVar5);
                abort();
              }
              iVar8 = 1;
            }
          }
          uVar3 = uVar3 + iVar8;
          pFVar6 = pFVar6 + 1;
        } while (pFVar6 != pFVar2);
        uVar3 = (uint)(0 < (int)uVar3);
      }
LAB_001b1c4e:
      return SUB41(uVar3,0);
    }
    pFVar7 = &pOVar4->fodder1;
    if (pOVar4->kind == FIELD_STR) {
      pFVar7 = &pOVar4->expr1->openFodder;
    }
    pFVar6 = (pFVar7->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (pFVar7->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar6 != pFVar2) {
      iVar8 = 0;
      do {
        KVar1 = pFVar6->kind;
        if (KVar1 == PARAGRAPH) {
          iVar9 = (int)((ulong)((long)(pFVar6->comment).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pFVar6->comment).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                  pFVar6->blanks;
        }
        else {
          iVar9 = 0;
          if (KVar1 != INTERSTITIAL) {
            if (KVar1 != LINE_END) goto LAB_001b1c50;
            iVar9 = 1;
          }
        }
        iVar8 = iVar8 + iVar9;
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != pFVar2);
      if (0 < iVar8) {
        uVar3 = 1;
        if (!bVar10) goto LAB_001b1c4e;
        goto LAB_001b1c01;
      }
    }
    pOVar4 = pOVar4 + 1;
  } while( true );
}

Assistant:

bool shouldExpand(Object *object)
    {
        for (auto &field : object->fields) {
            if (countNewlines(objectFieldOpenFodder(field)) > 0) {
                return true;
            }
        }
        if (countNewlines(object->closeFodder) > 0) {
            return true;
        }
        return false;
    }